

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status curi_parse_full_uri(char *uri,size_t len,curi_settings *settings,void *userData)

{
  curi_status cVar1;
  char *pcVar2;
  curi_settings defaultSettings;
  size_t local_a0;
  curi_settings local_98;
  
  local_a0 = 0;
  if (settings == (curi_settings *)0x0) {
    settings = &local_98;
    local_98.fragment_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.query_item_double_callback = (_func_int_void_ptr_char_ptr_size_t_double *)0x0;
    local_98.query_item_str_callback = (_func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *)0x0;
    local_98.query_item_null_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.query_item_int_callback = (_func_int_void_ptr_char_ptr_size_t_long *)0x0;
    local_98.path_segment_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.query_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.port_callback = (_func_int_void_ptr_uint *)0x0;
    local_98.path_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.host_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.portStr_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.scheme_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.userinfo_callback = (_func_int_void_ptr_char_ptr_size_t *)0x0;
    local_98.url_decode = 0;
    local_98._132_4_ = 0;
    local_98.allocate = default_allocate;
    local_98.deallocate = default_deallocate;
    local_98.query_item_separator = '&';
    local_98.query_item_key_separator = '=';
    local_98._114_6_ = 0;
  }
  cVar1 = parse_full_uri(uri,len,&local_a0,settings,userData);
  if (cVar1 == curi_status_success) {
    pcVar2 = "";
    if (local_a0 < len) {
      pcVar2 = uri + local_a0;
    }
    cVar1 = (uint)(*pcVar2 != '\0') * 2;
  }
  return cVar1;
}

Assistant:

curi_status curi_parse_full_uri(const char* uri, size_t len, const curi_settings* settings /*= 0*/, void* userData /*= 0*/)
{
    size_t offset = 0;
    curi_status status;

    if (settings)
    {
        // parsing with the given settings
        status = parse_full_uri(uri, len, &offset, settings, userData);
    }
    else
    {
        curi_settings defaultSettings;
        curi_default_settings(&defaultSettings);
        // parsing with default settings
        status = parse_full_uri(uri, len, &offset, &defaultSettings, userData);
    }

    if (status == curi_status_success && *read_char(uri,len,&offset) != '\0')
        // the URI weren't fully consumed
        // TODO: set an error string somewhere
        status = curi_status_error;

    return status;
}